

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.c
# Opt level: O2

void var_ht_put(VarHashTable *ht,VarHTItemKey key,Variable value)

{
  char *pcVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint uVar4;
  char *pcVar5;
  uint64_t uVar6;
  VarHTItemKey *__ptr;
  uint uVar7;
  VarHTItemKey *pVVar8;
  uint32_t i;
  ulong uVar9;
  VarHashTable new_ht;
  
  uVar3 = hash_string(key.key_ident_string,key.ident_length);
  uVar7 = ht->cap;
  pcVar5 = (char *)malloc(0x28);
  pcVar5[0x20] = '\0';
  pcVar5[0x21] = '\0';
  pcVar5[0x22] = '\0';
  pcVar5[0x23] = '\0';
  pcVar5[0x24] = '\0';
  pcVar5[0x25] = '\0';
  pcVar5[0x26] = '\0';
  pcVar5[0x27] = '\0';
  *(char **)pcVar5 = key.key_ident_string;
  *(size_t *)(pcVar5 + 8) = key.ident_length;
  *(long *)(pcVar5 + 0x10) = value._0_8_;
  *(long *)(pcVar5 + 0x18) = value._8_8_;
  pVVar8 = (VarHTItemKey *)(ht->buckets + (uVar7 - 1 & uVar3));
  __ptr = (VarHTItemKey *)pVVar8->key_ident_string;
  if (__ptr == (VarHTItemKey *)0x0) {
LAB_00105e72:
    pVVar8->key_ident_string = pcVar5;
    uVar4 = ht->size + 1;
    ht->size = uVar4;
  }
  else {
    _Var2 = equals(*__ptr,key);
    if (!_Var2) {
      do {
        pVVar8 = __ptr;
        __ptr = (VarHTItemKey *)pVVar8[2].key_ident_string;
        if (__ptr == (VarHTItemKey *)0x0) {
          pVVar8 = pVVar8 + 2;
          goto LAB_00105e72;
        }
        _Var2 = equals(*__ptr,key);
      } while (!_Var2);
      pVVar8 = pVVar8 + 2;
    }
    pcVar1 = __ptr[2].key_ident_string;
    free(__ptr);
    pVVar8->key_ident_string = pcVar5;
    *(char **)(pcVar5 + 0x20) = pcVar1;
    uVar7 = ht->cap;
    uVar4 = ht->size;
  }
  if (uVar7 < uVar4) {
    uVar6 = next_pow_of_2((ulong)(uVar7 + 1));
    var_ht_init(&new_ht,(uint32_t)uVar6);
    for (uVar9 = 0; uVar9 < ht->cap; uVar9 = uVar9 + 1) {
      for (pVVar8 = (VarHTItemKey *)(ht->buckets + uVar9);
          pVVar8 = (VarHTItemKey *)pVVar8->key_ident_string, pVVar8 != (VarHTItemKey *)0x0;
          pVVar8 = pVVar8 + 2) {
        var_ht_put(&new_ht,*pVVar8,*(Variable *)(pVVar8 + 1));
      }
    }
    var_ht_free(ht);
    ht->cap = new_ht.cap;
    ht->size = new_ht.size;
    ht->buckets = new_ht.buckets;
  }
  return;
}

Assistant:

void var_ht_put(VarHashTable *ht, VarHTItemKey key, Variable value) {
    uint32_t index = var_hash(key) & (ht->cap - 1);
    VarHTItem *new_item = malloc(sizeof(VarHTItem));
    new_item->next = NULL;
    new_item->key = key;
    new_item->value = value;

    bool already_inside = false;
    if (ht->buckets[index] == NULL) {
        ht->buckets[index] = new_item;
    } else {
        already_inside = insert(&ht->buckets[index], key, new_item);
    }

    if (!already_inside) {
        ++ht->size;
    }

    if (ht->size > ht->cap) {
        resize(ht);
    }
}